

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O1

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  TString *pTVar5;
  uint *puVar6;
  long *plVar7;
  unsigned_long *puVar8;
  undefined8 *puVar9;
  StkId pTVar10;
  size_t sVar11;
  Value *pVVar12;
  int *piVar13;
  Value VVar14;
  int iVar15;
  char *__s;
  char buff;
  char local_58 [8];
  char local_50 [32];
  
  iVar15 = 0;
  do {
    pcVar4 = strchr(fmt,0x25);
    if (pcVar4 != (char *)0x0) {
      pTVar10 = L->top;
      pTVar5 = luaS_newlstr(L,fmt,(long)pcVar4 - (long)fmt);
      (pTVar10->value_).gc = (GCObject *)pTVar5;
      pTVar10->tt_ = pTVar5->tt | 0x40;
      luaD_inctop(L);
      bVar1 = pcVar4[1];
      if (bVar1 < 100) {
        if (bVar1 < 0x55) {
          if (bVar1 != 0x25) {
            if (bVar1 != 0x49) {
LAB_00118d90:
              luaG_runerror(L,"invalid option \'%%%c\' to \'lua_pushfstring\'",
                            (ulong)(uint)(int)(char)bVar1);
            }
            pTVar10 = L->top;
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              pVVar12 = (Value *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              pVVar12 = (Value *)argp->overflow_arg_area;
              argp->overflow_arg_area = pVVar12 + 1;
            }
            VVar14 = *pVVar12;
LAB_00118c32:
            pTVar10->value_ = VVar14;
            iVar3 = 0x13;
            goto LAB_00118c55;
          }
          pTVar10 = L->top;
          sVar11 = 1;
          __s = "%";
        }
        else if (bVar1 == 0x55) {
          uVar2 = argp->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar8 = (unsigned_long *)((ulong)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            puVar8 = (unsigned_long *)argp->overflow_arg_area;
            argp->overflow_arg_area = puVar8 + 1;
          }
          iVar3 = luaO_utf8esc(local_58,*puVar8);
          sVar11 = (size_t)iVar3;
          pTVar10 = L->top;
          __s = local_50 + -sVar11;
        }
        else {
          if (bVar1 != 99) goto LAB_00118d90;
          uVar2 = argp->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar6 = (uint *)((ulong)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            puVar6 = (uint *)argp->overflow_arg_area;
            argp->overflow_arg_area = puVar6 + 2;
          }
          local_58[0] = (char)*puVar6;
          if ((""[(ulong)(*puVar6 & 0xff) + 1] & 4) == 0) {
            luaO_pushfstring(L,"<\\%d>");
            goto LAB_00118d0a;
          }
          pTVar10 = L->top;
          sVar11 = 1;
          __s = local_58;
        }
LAB_00118ced:
        pTVar5 = luaS_newlstr(L,__s,sVar11);
        (pTVar10->value_).gc = (GCObject *)pTVar5;
        pTVar10->tt_ = pTVar5->tt | 0x40;
        luaD_inctop(L);
      }
      else {
        if (0x6f < bVar1) {
          if (bVar1 == 0x70) {
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              puVar9 = (undefined8 *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              puVar9 = (undefined8 *)argp->overflow_arg_area;
              argp->overflow_arg_area = puVar9 + 1;
            }
            iVar3 = snprintf(local_58,0x28,"%p",*puVar9);
            sVar11 = (size_t)iVar3;
            pTVar10 = L->top;
            __s = local_58;
          }
          else {
            if (bVar1 != 0x73) goto LAB_00118d90;
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              plVar7 = (long *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              plVar7 = (long *)argp->overflow_arg_area;
              argp->overflow_arg_area = plVar7 + 1;
            }
            __s = (char *)*plVar7;
            if (__s == (char *)0x0) {
              __s = "(null)";
            }
            sVar11 = strlen(__s);
            pTVar10 = L->top;
          }
          goto LAB_00118ced;
        }
        if (bVar1 == 100) {
          pTVar10 = L->top;
          uVar2 = argp->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            piVar13 = (int *)((ulong)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            piVar13 = (int *)argp->overflow_arg_area;
            argp->overflow_arg_area = piVar13 + 2;
          }
          VVar14 = (Value)(long)*piVar13;
          goto LAB_00118c32;
        }
        if (bVar1 != 0x66) goto LAB_00118d90;
        pTVar10 = L->top;
        uVar2 = argp->fp_offset;
        if ((ulong)uVar2 < 0xa1) {
          pVVar12 = (Value *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->fp_offset = uVar2 + 0x10;
        }
        else {
          pVVar12 = (Value *)argp->overflow_arg_area;
          argp->overflow_arg_area = pVVar12 + 1;
        }
        pTVar10->value_ = *pVVar12;
        iVar3 = 3;
LAB_00118c55:
        pTVar10->tt_ = iVar3;
        luaD_inctop(L);
        luaO_tostring(L,L->top + -1);
      }
LAB_00118d0a:
      iVar15 = iVar15 + 2;
      fmt = pcVar4 + 2;
    }
    if (pcVar4 == (char *)0x0) {
      if ((long)L->stack_last - (long)L->top < 0x11) {
        luaD_growstack(L,1);
      }
      sVar11 = strlen(fmt);
      pTVar10 = L->top;
      pTVar5 = luaS_newlstr(L,fmt,sVar11);
      (pTVar10->value_).gc = (GCObject *)pTVar5;
      pTVar10->tt_ = pTVar5->tt | 0x40;
      luaD_inctop(L);
      if (0 < iVar15) {
        luaV_concat(L,iVar15 + 1);
      }
      return (char *)(L->top[-1].value_.f + 0x18);
    }
  } while( true );
}

Assistant:

const char *luaO_pushvfstring (lua_State *L, const char *fmt, va_list argp) {
  int n = 0;
  for (;;) {
    const char *e = strchr(fmt, '%');
    if (e == NULL) break;
    pushstr(L, fmt, e - fmt);
    switch (*(e+1)) {
      case 's': {  /* zero-terminated string */
        const char *s = va_arg(argp, char *);
        if (s == NULL) s = "(null)";
        pushstr(L, s, strlen(s));
        break;
      }
      case 'c': {  /* an 'int' as a character */
        char buff = cast(char, va_arg(argp, int));
        if (lisprint(cast_uchar(buff)))
          pushstr(L, &buff, 1);
        else  /* non-printable character; print its code */
          luaO_pushfstring(L, "<\\%d>", cast_uchar(buff));
        break;
      }
      case 'd': {  /* an 'int' */
        setivalue(L->top, va_arg(argp, int));
        goto top2str;
      }
      case 'I': {  /* a 'lua_Integer' */
        setivalue(L->top, cast(lua_Integer, va_arg(argp, l_uacInt)));
        goto top2str;
      }
      case 'f': {  /* a 'lua_Number' */
        setfltvalue(L->top, cast_num(va_arg(argp, l_uacNumber)));
      top2str:  /* convert the top element to a string */
        luaD_inctop(L);
        luaO_tostring(L, L->top - 1);
        break;
      }
      case 'p': {  /* a pointer */
        char buff[4*sizeof(void *) + 8]; /* should be enough space for a '%p' */
        void *p = va_arg(argp, void *);
        int l = lua_pointer2str(buff, sizeof(buff), p);
        pushstr(L, buff, l);
        break;
      }
      case 'U': {  /* an 'int' as a UTF-8 sequence */
        char buff[UTF8BUFFSZ];
        int l = luaO_utf8esc(buff, cast(long, va_arg(argp, long)));
        pushstr(L, buff + UTF8BUFFSZ - l, l);
        break;
      }
      case '%': {
        pushstr(L, "%", 1);
        break;
      }
      default: {
        luaG_runerror(L, "invalid option '%%%c' to 'lua_pushfstring'",
                         *(e + 1));
      }
    }
    n += 2;
    fmt = e+2;
  }
  luaD_checkstack(L, 1);
  pushstr(L, fmt, strlen(fmt));
  if (n > 0) luaV_concat(L, n + 1);
  return svalue(L->top - 1);
}